

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O1

void __thiscall despot::Navigation::Init(Navigation *this,istream *is)

{
  int *piVar1;
  int *piVar2;
  vector<double,_std::allocator<double>_> *this_00;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *this_01;
  double dVar3;
  pointer pdVar4;
  pointer pvVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  istream *piVar9;
  istream *this_02;
  State *pSVar10;
  unsigned_long uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  string tok;
  long local_b8;
  State local_78 [32];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  double local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  piVar9 = std::operator>>(is,(string *)&local_58);
  piVar9 = std::operator>>(piVar9,(string *)&local_58);
  piVar1 = &this->ysize_;
  this_02 = (istream *)std::istream::operator>>((istream *)piVar9,piVar1);
  piVar2 = &this->xsize_;
  std::istream::operator>>(this_02,piVar2);
  std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::resize
            (&this->states_,((long)this->ysize_ * (long)this->xsize_ + 1) * (long)flag_size_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->obs_,(long)this->ysize_ * (long)this->xsize_ + 1);
  this_00 = &this->trap_prob_;
  std::vector<double,_std::allocator<double>_>::resize
            (this_00,(long)this->ysize_ * (long)this->xsize_ + 1);
  this->trap_pos_ = this->xsize_ * this->ysize_;
  if (0 < this->ysize_) {
    iVar17 = 0;
    do {
      iVar15 = *piVar2;
      if (0 < iVar15) {
        iVar18 = 0;
        do {
          iVar15 = iVar15 * iVar17 + iVar18;
          if (0 < flag_size_) {
            lVar13 = 0;
            do {
              iVar8 = flag_size_;
              pSVar10 = (State *)operator_new(0x20);
              despot::State::State(pSVar10);
              *(undefined ***)pSVar10 = &PTR__State_0010eaa0;
              *(int *)(pSVar10 + 0xc) = iVar8 * iVar15 + (int)lVar13;
              (this->states_).
              super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)flag_size_ * (long)iVar15 + lVar13] =
                   (NavigationState *)pSVar10;
              lVar13 = lVar13 + 1;
            } while ((int)lVar13 < flag_size_);
          }
          std::istream::_M_extract<double>((double *)is);
          pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar3 = pdVar4[iVar15];
          if ((dVar3 == -1.0) && (!NAN(dVar3))) {
            this->goal_pos_ = iVar15;
            pdVar4[iVar15] = 0.0;
          }
          if (iVar18 == 0 && iVar17 == 0) {
            uVar11 = 0;
          }
          else if ((iVar17 != 0) || (uVar11 = 1, iVar18 != *piVar2 + -1)) {
            uVar11 = 2;
            if ((iVar17 != *piVar1 + -1 || iVar18 != 0) &&
               ((iVar17 != *piVar1 + -1 || (uVar11 = 3, iVar18 != *piVar2 + -1)))) {
              uVar11 = 4;
            }
          }
          (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[iVar15] = uVar11;
          iVar18 = iVar18 + 1;
          iVar15 = *piVar2;
        } while (iVar18 < iVar15);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < *piVar1);
  }
  iVar17 = this->trap_pos_;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[iVar17] = 4;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar17] = 1.0;
  if (0 < flag_size_) {
    lVar13 = 0;
    do {
      iVar15 = flag_size_;
      pSVar10 = (State *)operator_new(0x20);
      iVar17 = this->trap_pos_;
      despot::State::State(pSVar10);
      *(undefined ***)pSVar10 = &PTR__State_0010eaa0;
      *(int *)(pSVar10 + 0xc) = iVar17 * iVar15 + (int)lVar13;
      (this->states_).
      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)this->trap_pos_ * (long)flag_size_ + lVar13] =
           (NavigationState *)pSVar10;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 < flag_size_);
  }
  this_01 = &this->transition_probabilities_;
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(this_01,(long)(this->states_).
                         super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->states_).
                         super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((this->states_).
      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->states_).
      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      pvVar5 = (this->transition_probabilities_).
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar17 = (**(code **)(*(long *)this + 0x28))(this);
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize(pvVar5 + uVar14,(long)iVar17);
      local_b8 = 0;
      lVar13 = 0;
      while( true ) {
        iVar17 = (**(code **)(*(long *)this + 0x28))(this);
        if (iVar17 <= lVar13) break;
        uVar12 = (uint)uVar14;
        lVar6 = (long)flag_size_;
        bVar7 = flag_bits_ & 0x1f;
        iVar17 = NextPosition(this,uVar12 >> bVar7,(ACT_TYPE)lVar13);
        uVar16 = (uint)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) %
                       lVar6);
        if (uVar16 == 1) {
          lVar6 = *(long *)&(this_01->
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar14].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          if (uVar12 >> bVar7 == 0) {
            despot::State::State(local_78,flag_size_ + 3,0.49);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
            lVar6 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,(*piVar2 + -2) * flag_size_ + 7,0.51);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
          }
          else {
            despot::State::State(local_78,uVar12,1.0);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
          }
LAB_001073dd:
          despot::State::~State(local_78);
        }
        else {
          if (uVar16 == 0) {
            lVar6 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            if (uVar12 >> bVar7 == 0) {
              despot::State::State(local_78,1,1.0);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8)
                         ,local_78);
            }
            else {
              despot::State::State(local_78,uVar12,1.0);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8)
                         ,local_78);
            }
            goto LAB_001073dd;
          }
          if ((uVar16 & 0x7ffffffb) != 3) {
            lVar6 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,uVar12,1.0);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            goto LAB_001073dd;
          }
          dVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar17];
          dVar19 = 1.0 - dVar3;
          if (0.0 < dVar19) {
            lVar6 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            local_38 = dVar19;
            despot::State::State(local_78,flag_size_ * iVar17 + 3,dVar19 * 0.49);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
            lVar6 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,iVar17 * flag_size_ + 7,local_38 * 0.51);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
          }
          if (0.0 < dVar3) {
            lVar6 = *(long *)&(this->transition_probabilities_).
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,flag_size_ * this->trap_pos_ + 3,dVar3 * 0.49);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
            lVar6 = *(long *)&(this->transition_probabilities_).
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,flag_size_ * this->trap_pos_ + 7,dVar3 * 0.51);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            goto LAB_001073dd;
          }
        }
        lVar13 = lVar13 + 1;
        local_b8 = local_b8 + 0x18;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)(this->states_).
                                    super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->states_).
                                    super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void Navigation::Init(istream& is) {
	string tok;
	is >> tok >> tok >> ysize_ >> xsize_;
	states_.resize(flag_size_ * (xsize_ * ysize_ + 1));
	obs_.resize(xsize_ * ysize_ + 1);
	trap_prob_.resize(xsize_ * ysize_ + 1);
	trap_pos_ = xsize_ * ysize_;
	for (int y = 0; y < ysize_; y++) {
		for (int x = 0; x < xsize_; x++) {
			int pos = y * xsize_ + x;
			for (int i = 0; i < flag_size_; i++)
				states_[flag_size_ * pos + i] = new NavigationState(
					flag_size_ * pos + i);

			is >> trap_prob_[pos];

			if (trap_prob_[pos] == -1) {
				goal_pos_ = pos;
				trap_prob_[pos] = 0;
			}

			if (y == 0 && x == 0)
				obs_[pos] = 0;
			else if (y == 0 && x == xsize_ - 1)
				obs_[pos] = 1;
			else if (y == ysize_ - 1 && x == 0)
				obs_[pos] = 2;
			else if (y == ysize_ - 1 && x == xsize_ - 1)
				obs_[pos] = 3;
			else
				obs_[pos] = 4;
		}
	}
	obs_[trap_pos_] = 4;
	trap_prob_[trap_pos_] = 1.0;
	for (int i = 0; i < flag_size_; i++) {
		states_[flag_size_ * trap_pos_ + i] = new NavigationState(
			flag_size_ * trap_pos_ + i);
	}

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			int flag = s % flag_size_;
			int pos = s >> flag_bits_;
			int next_pos = NextPosition(pos, a);

			if (flag == 0) { // Transition for first step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(State(1, 1.0));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 1) { // Transition for second step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(
						State(3 + 1 * flag_size_, 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + (xsize_ - 2) * flag_size_, 0.51));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 3 || flag == 7) { // Transition for remaining steps
				double prob = trap_prob_[next_pos];

				if (1 - prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + next_pos * flag_size_, (1 - prob) * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + next_pos * flag_size_, (1 - prob) * 0.51));
				}

				if (prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + trap_pos_ * flag_size_, prob * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + trap_pos_ * flag_size_, prob * 0.51));
				}
			} else { // Self transition
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			}
		}
	}

	// PrintTransitions();
}